

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.cpp
# Opt level: O0

uint32_t ZiScanDB(char *content,hs_database_t *db,hs_scratch_t *sc)

{
  size_t sVar1;
  uint32_t local_2c;
  hs_error_t err;
  uint32_t id;
  hs_scratch_t *sc_local;
  hs_database_t *db_local;
  char *content_local;
  
  if (((db == (hs_database_t *)0x0) || (content == (char *)0x0)) || (*content == '\0')) {
    content_local._4_4_ = 0;
  }
  else {
    local_2c = 0;
    _err = sc;
    sc_local = (hs_scratch_t *)db;
    db_local = (hs_database_t *)content;
    sVar1 = strlen(content);
    hs_scan(db,content,sVar1 & 0xffffffff,0,_err,ZiOnMatch,&local_2c);
    content_local._4_4_ = local_2c;
  }
  return content_local._4_4_;
}

Assistant:

uint32_t ZiScanDB(const char* content, const hs_database_t* db, hs_scratch_t* sc)
{
    if (!db || !content || *content == '\0')
    {
        return 0U;
    }

    uint32_t id = 0U;
    hs_error_t err = hs_scan(db, content, strlen(content), 0, sc, ZiOnMatch, &id);
    if (err != HS_SUCCESS)
    {}
    return id;
}